

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::HasProperty_Internal<false>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,bool *noRedecl,PropertyValueInfo *info,bool *pDeclaredProperty,
          bool *pNonconfigurableProperty)

{
  byte bVar1;
  bool bVar2;
  unsigned_short uVar3;
  uint32 index;
  BOOL BVar4;
  int local_44;
  PropertyRecord *pPStack_40;
  int i;
  PropertyRecord *propertyRecord;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  
  if (propertyId == -1) {
    BVar4 = 0;
  }
  else {
    pPStack_40 = ScriptContext::GetPropertyName
                           ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr
                             )->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
    bVar2 = JsUtil::
            BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetReference<Js::PropertyRecord_const*>
                      ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)(this->propertyMap).ptr,&stack0xffffffffffffffc0,
                       (DictionaryPropertyDescriptor<unsigned_short> **)&propertyRecord,&local_44);
    if (bVar2) {
      bVar1 = *(byte *)((long)&(propertyRecord->super_FinalizableObject).
                               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1);
      BVar4 = 0;
      if (((bVar1 & 8) == 0) &&
         (((bVar1 & 0x10) == 0 ||
          (BVar4 = 0,
          ((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject & 2) != 0)))) {
        if (0x3f < bVar1 && noRedecl != (bool *)0x0) {
          *noRedecl = true;
        }
        if (0x1f < bVar1 && pDeclaredProperty != (bool *)0x0) {
          *pDeclaredProperty = true;
        }
        if ((pNonconfigurableProperty != (bool *)0x0) && ((bVar1 & 2) == 0)) {
          *pNonconfigurableProperty = true;
        }
        BVar4 = 1;
        if (info != (PropertyValueInfo *)0x0) {
          uVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>
                            ((DictionaryPropertyDescriptor<unsigned_short> *)propertyRecord);
          if (uVar3 == 0xffff) {
            uVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex
                              ((DictionaryPropertyDescriptor<unsigned_short> *)propertyRecord);
            if (uVar3 == 0xffff) {
              return 1;
            }
          }
          else {
            bVar1 = *(byte *)((long)&(propertyRecord->super_FinalizableObject).
                                     super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1);
            info->m_instance = &instance->super_RecyclableObject;
            info->m_propertyIndex = uVar3;
            info->m_attributes = bVar1;
            info->flags = InlineCacheNoFlags;
            if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject & 0x28) != 8) {
              *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag & 0xfb;
            }
            if ((bVar1 & 8) == 0) {
              return 1;
            }
          }
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = 0xffff;
          info->m_attributes = '\0';
          info->flags = InlineCacheNoFlags;
        }
      }
    }
    else {
      bVar2 = DynamicObject::HasObjectArray(instance);
      BVar4 = 0;
      if ((bVar2) && (pPStack_40->isNumeric == true)) {
        index = PropertyRecord::GetNumericValue(pPStack_40);
        BVar4 = DynamicTypeHandler::HasItem(&this->super_DynamicTypeHandler,instance,index);
      }
    }
  }
  return BVar4;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::HasProperty_Internal(DynamicObject* instance, PropertyId propertyId, bool *noRedecl, _Inout_opt_ PropertyValueInfo* info, bool *pDeclaredProperty, bool *pNonconfigurableProperty)
    {
        // HasProperty is called with NoProperty in JavascriptDispatch.cpp to for undeferral of the
        // deferred type system that DOM objects use.  Allow NoProperty for this reason, but only
        // here in HasProperty.
        if (propertyId == Constants::NoProperty)
        {
            return false;
        }

        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if ((descriptor->Attributes & PropertyDeleted) || (!allowLetConstGlobal && !descriptor->HasNonLetConstGlobal()))
            {
                return false;
            }
            if (noRedecl && descriptor->Attributes & PropertyNoRedecl)
            {
                *noRedecl = true;
            }
            if (pDeclaredProperty && descriptor->Attributes & (PropertyNoRedecl | PropertyDeclaredGlobal))
            {
                *pDeclaredProperty = true;
            }
            if (pNonconfigurableProperty && !(descriptor->Attributes & PropertyConfigurable))
            {
                *pNonconfigurableProperty = true;
            }
            if (info)
            {
                T dataSlot = descriptor->template GetDataPropertyIndex<allowLetConstGlobal>();
                if (dataSlot != NoSlots)
                {
                    SetPropertyValueInfo(info, instance, dataSlot, descriptor);
                }
                else if (descriptor->GetGetterPropertyIndex() != NoSlots)
                {
                    // PropertyAttributes is only one byte so it can't carry out data about whether this is an accessor.
                    // Accessors must be cached differently than normal properties, so if we want to cache this we must
                    // do so here rather than in the caller. However, caching here would require passing originalInstance and
                    // requestContext through a wide variety of call paths to this point (like we do for GetProperty), for
                    // very little improvement. For now, just block caching this case.
                    PropertyValueInfo::SetNoCache(info, instance);
                }
            }
            return true;
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return DictionaryTypeHandlerBase<T>::HasItem(instance, propertyRecord->GetNumericValue());
        }

        return false;
    }